

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_null_check_end(t_netstd_generator *this,ostream *out,t_field *tfield)

{
  int *piVar1;
  e_req eVar2;
  bool bVar3;
  ostream *poVar4;
  string local_40;
  
  eVar2 = tfield->req_;
  bVar3 = type_can_be_null(tfield->type_);
  if ((eVar2 != T_REQUIRED) || (bVar3)) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_40);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_null_check_end(ostream& out, t_field* tfield) {
    bool is_required = field_is_required(tfield);
    bool null_allowed = type_can_be_null(tfield->get_type());

    if( null_allowed || (!is_required)) {
        indent_down();
        out << indent() << "}" << endl;
    }
}